

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int pigpioOpenSocket(char *addrStr,char *portStr)

{
  int iVar1;
  int __fd;
  addrinfo *paVar2;
  int opt;
  addrinfo *res;
  undefined4 local_54;
  addrinfo *local_50;
  addrinfo local_48;
  
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 0;
  local_48.ai_flags = 2;
  local_48.ai_family = 0;
  iVar1 = getaddrinfo(addrStr,portStr,&local_48,&local_50);
  __fd = -0x7d2;
  if (iVar1 == 0) {
    if (local_50 == (addrinfo *)0x0) {
      __fd = -0x7d3;
      local_50 = (addrinfo *)0x0;
    }
    else {
      paVar2 = local_50;
      do {
        __fd = socket(paVar2->ai_family,paVar2->ai_socktype,paVar2->ai_protocol);
        if (__fd != -1) {
          local_54 = 1;
          setsockopt(__fd,6,1,&local_54,4);
          iVar1 = connect(__fd,paVar2->ai_addr,paVar2->ai_addrlen);
          if (iVar1 != -1) goto LAB_0010587c;
        }
        paVar2 = paVar2->ai_next;
      } while (paVar2 != (addrinfo *)0x0);
      __fd = -0x7d3;
    }
LAB_0010587c:
    freeaddrinfo(local_50);
  }
  return __fd;
}

Assistant:

static int pigpioOpenSocket(char *addrStr, char *portStr)
{
   int sock, err, opt;
   struct addrinfo hints, *res, *rp;

   memset (&hints, 0, sizeof (hints));

   hints.ai_family   = PF_UNSPEC;
   hints.ai_socktype = SOCK_STREAM;
   hints.ai_flags   |= AI_CANONNAME;

   err = getaddrinfo (addrStr, portStr, &hints, &res);

   if (err) return pigif_bad_getaddrinfo;

   for (rp=res; rp!=NULL; rp=rp->ai_next)
   {
      sock = socket(rp->ai_family, rp->ai_socktype, rp->ai_protocol);

      if (sock == -1) continue;

      /* Disable the Nagle algorithm. */
      opt = 1;
      setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char*)&opt, sizeof(int));

      if (connect(sock, rp->ai_addr, rp->ai_addrlen) != -1) break;
   }

   freeaddrinfo(res);

   if (rp == NULL) return pigif_bad_connect;

   return sock;
}